

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O2

enable_if_t<std::is_signed<short>::value_&&_(std::is_signed<unsigned_short>::value____(std::is_unsigned<unsigned_short>::value_&&_std::is_signed<std::common_type_t<short,_unsigned_short>_>::value)),_short>
 burst::divceil<short,unsigned_short>(Integer<short> n,Integer<unsigned_short> divisor)

{
  short sVar1;
  domain_error *this;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,divisor) != 0) {
    if (n < 1) {
      sVar1 = (short)((int)n / (int)(uint)divisor);
    }
    else {
      sVar1 = (short)((n + -1) / (int)(uint)divisor) + 1;
    }
    return sVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1fcf7);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }